

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

bool nite::isUpper(string *Input)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  do {
    uVar5 = (ulong)uVar4;
    uVar1 = Input->_M_string_length;
    if (uVar1 <= uVar5) break;
    pcVar2 = (char *)std::__cxx11::string::at((ulong)Input);
    iVar3 = isupper((int)*pcVar2);
    uVar4 = uVar4 + 1;
  } while (iVar3 != 0);
  return uVar1 <= uVar5;
}

Assistant:

bool nite::isUpper(const String &Input){
	for (unsigned i=0; i<Input.length(); i++){
		char c = Input.at(i);
		if (!isupper(c))
			return 0;
	}
	return 1;
}